

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

QMetaEnumBuilder __thiscall
QMetaObjectBuilder::addEnumerator(QMetaObjectBuilder *this,QMetaEnum *prototype)

{
  QMetaType metaType;
  int iVar1;
  long in_FS_OFFSET;
  QMetaEnumBuilder QVar2;
  optional<unsigned_long_long> oVar3;
  int index;
  int count;
  QMetaEnumBuilder en;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  QMetaEnumBuilder *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  QByteArray *in_stack_ffffffffffffff00;
  QMetaEnumBuilder *in_stack_ffffffffffffff08;
  int index_00;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  _Storage<unsigned_long_long,_true> in_stack_ffffffffffffff18;
  QByteArray *in_stack_ffffffffffffff20;
  QByteArray *pQVar4;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int local_b8;
  QByteArray local_68;
  QMetaObjectBuilder *local_50;
  int local_48;
  QByteArray local_40;
  _Storage<unsigned_long_long,_true> local_28;
  undefined1 local_20;
  QMetaObjectBuilder *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (QMetaObjectBuilder *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  QMetaEnum::name((QMetaEnum *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  pQVar4 = &local_40;
  QByteArray::QByteArray
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
             CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  QVar2 = addEnumerator((QMetaObjectBuilder *)
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),pQVar4);
  local_50 = QVar2._mobj;
  local_48 = QVar2._index;
  puStack_10 = (undefined1 *)CONCAT44(puStack_10._4_4_,local_48);
  local_18 = local_50;
  QByteArray::~QByteArray((QByteArray *)0x3734ee);
  QMetaEnum::enumName((QMetaEnum *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  pQVar4 = &local_68;
  QByteArray::QByteArray
            (pQVar4,(char *)in_stack_ffffffffffffff18,
             CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  QMetaEnumBuilder::setEnumName
            (in_stack_fffffffffffffef0,
             (QByteArray *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  QByteArray::~QByteArray((QByteArray *)0x373538);
  QMetaEnum::metaType((QMetaEnum *)in_stack_ffffffffffffff08);
  metaType.d_ptr._4_4_ = in_stack_fffffffffffffefc;
  metaType.d_ptr._0_4_ = in_stack_fffffffffffffef8;
  QMetaEnumBuilder::setMetaType(in_stack_fffffffffffffef0,metaType);
  QMetaEnum::isFlag((QMetaEnum *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  QMetaEnumBuilder::setIsFlag(in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeef);
  QMetaEnum::isScoped((QMetaEnum *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  QMetaEnumBuilder::setIsScoped(in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeef);
  iVar1 = QMetaEnum::keyCount((QMetaEnum *)
                              CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  for (local_b8 = 0; local_b8 < iVar1; local_b8 = local_b8 + 1) {
    QMetaEnum::key((QMetaEnum *)in_stack_ffffffffffffff08,
                   (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    index_00 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    QByteArray::QByteArray
              (pQVar4,(char *)in_stack_ffffffffffffff18,
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    oVar3 = QMetaEnum::value64((QMetaEnum *)
                               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                               index_00);
    in_stack_ffffffffffffff18._M_value =
         oVar3.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long_long>._M_payload;
    in_stack_ffffffffffffff17 =
         oVar3.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long_long>._M_engaged;
    local_28._M_value = in_stack_ffffffffffffff18._M_value;
    local_20 = in_stack_ffffffffffffff17;
    in_stack_ffffffffffffff08 =
         (QMetaEnumBuilder *)
         std::optional<unsigned_long_long>::value_or<int>
                   ((optional<unsigned_long_long> *)
                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                    (int *)in_stack_fffffffffffffef0);
    QMetaEnumBuilder::addKey
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QByteArray::~QByteArray((QByteArray *)0x37366f);
  }
  QMetaEnum::is64Bit((QMetaEnum *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  QMetaEnumBuilder::setIs64Bit(in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeef);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar2._index = puStack_10._0_4_;
    QVar2._mobj = local_18;
    QVar2._12_4_ = 0;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QMetaEnumBuilder QMetaObjectBuilder::addEnumerator(const QMetaEnum &prototype)
{
    QMetaEnumBuilder en = addEnumerator(prototype.name());
    en.setEnumName(prototype.enumName());
    en.setMetaType(prototype.metaType());
    en.setIsFlag(prototype.isFlag());
    en.setIsScoped(prototype.isScoped());
    int count = prototype.keyCount();
    for (int index = 0; index < count; ++index)
        en.addKey(prototype.key(index), prototype.value64(index).value_or(0));
    // reset the is64Bit() flag if necessary
    en.setIs64Bit(prototype.is64Bit());
    return en;
}